

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzer.cpp
# Opt level: O3

void __thiscall CanAnalyzer::GetRawFrame(CanAnalyzer *this)

{
  iterator iVar1;
  pointer puVar2;
  BitState BVar3;
  BitState BVar4;
  undefined8 in_RAX;
  U64 UVar5;
  pointer pBVar6;
  long lVar7;
  undefined8 local_38;
  
  this->mCanError = false;
  this->mRecessiveCount = 0;
  this->mDominantCount = 0;
  pBVar6 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar6) {
    (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar6;
  }
  local_38 = in_RAX;
  BVar3 = AnalyzerChannelData::GetBitState();
  BVar4 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
  if (BVar3 != BVar4) {
    AnalyzerHelpers::Assert("GetFrameOrError assumes we start DOMINANT");
  }
  UVar5 = AnalyzerChannelData::GetSampleNumber();
  this->mStartOfFrame = UVar5;
  lVar7 = 0;
  do {
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mCan);
    BVar3 = AnalyzerChannelData::GetBitState();
    BVar4 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
    if (BVar3 == BVar4) {
      this->mDominantCount = this->mDominantCount + 1;
      this->mRecessiveCount = 0;
      BVar3 = CanAnalyzerSettings::Dominant((this->mSettings)._M_ptr);
      local_38 = CONCAT44(BVar3,(BitState)local_38);
      iVar1._M_current =
           (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mRawBitResults,iVar1,(BitState *)((long)&local_38 + 4));
      }
      else {
        *iVar1._M_current = BVar3;
        (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if (this->mDominantCount == 6) {
        this->mCanError = true;
        puVar2 = (this->mSampleOffsets).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        this->mErrorStartingSample = (ulong)puVar2[(int)lVar7 - 4] + this->mStartOfFrame;
        this->mErrorEndingSample = (ulong)puVar2[lVar7 + 1] + this->mStartOfFrame;
        pBVar6 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -6;
        (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = pBVar6;
LAB_00107395:
        this->mNumRawBits =
             (U32)((ulong)((long)pBVar6 -
                          (long)(this->mRawBitResults).
                                super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        return;
      }
    }
    else {
      this->mRecessiveCount = this->mRecessiveCount + 1;
      this->mDominantCount = 0;
      BVar3 = CanAnalyzerSettings::Recessive((this->mSettings)._M_ptr);
      local_38 = CONCAT44(local_38._4_4_,BVar3);
      iVar1._M_current =
           (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mRawBitResults,iVar1,(BitState *)&local_38);
      }
      else {
        *iVar1._M_current = BVar3;
        (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if (this->mRecessiveCount == 7) {
        pBVar6 = (this->mRawBitResults).super__Vector_base<BitState,_std::allocator<BitState>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00107395;
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void CanAnalyzer::GetRawFrame()
{
    mCanError = false;
    mRecessiveCount = 0;
    mDominantCount = 0;
    mRawBitResults.clear();

    if( mCan->GetBitState() != mSettings->Dominant() )
        AnalyzerHelpers::Assert( "GetFrameOrError assumes we start DOMINANT" );

    mStartOfFrame = mCan->GetSampleNumber();

    U32 i = 0;
    // what we're going to do now is capture a sequence up until we get 7 recessive bits in a row.
    for( ;; )
    {
        if( i > 255 )
        {
            // we are in garbage data most likely, lets get out of here.
            return;
        }

        mCan->AdvanceToAbsPosition( mStartOfFrame + mSampleOffsets[ i ] );
        i++;

        if( mCan->GetBitState() == mSettings->Dominant() )
        {
            // the bit is DOMINANT
            mDominantCount++;
            mRecessiveCount = 0;
            mRawBitResults.push_back( mSettings->Dominant() );

            if( mDominantCount == 6 )
            {
                // we have detected an error.

                mCanError = true;
                mErrorStartingSample = mStartOfFrame + mSampleOffsets[ i - 5 ];
                mErrorEndingSample = mStartOfFrame + mSampleOffsets[ i ];

                // don't use any of these error bits in analysis.
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();
                mRawBitResults.pop_back();

                mNumRawBits = mRawBitResults.size();

                // the channel is currently high.  addvance it to the next start bit.
                // no, don't bother, we want to analyze this packet before we advance.

                break;
            }
        }
        else
        {
            // the bit is RECESSIVE
            mRecessiveCount++;
            mDominantCount = 0;
            mRawBitResults.push_back( mSettings->Recessive() );

            if( mRecessiveCount == 7 )
            {
                // we're done.
                break;
            }
        }
    }

    mNumRawBits = mRawBitResults.size();
}